

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> b;
  PositionType PVar1;
  AssertHelper local_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  String local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  FactorType FStack_a0;
  GammaType GStack_98;
  TypeIndexType TStack_90;
  undefined6 uStack_8e;
  AssertionResult gtest_ar_;
  PositionType position;
  MomentumType local_68;
  ParticleType particle;
  
  PVar1 = BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::getPosition
                    ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,432.453,
                     -3452.15,-15.125);
  position.x = PVar1.x;
  position.y = PVar1.y;
  local_68.x = 431.124;
  local_68.y = -54.12;
  local_68.z = 5643.176;
  pica::Particle<(pica::Dimension)2>::Particle(&particle,&position,&local_68,1.9945,0);
  local_a8 = particle.p.z;
  local_b8 = particle.p.x;
  dStack_b0 = particle.p.y;
  local_c8 = particle.position.x;
  dStack_c0 = particle.position.y;
  FStack_a0 = particle.factor;
  GStack_98 = particle.invGamma;
  TStack_90 = particle.typeIndex;
  b._58_6_ = uStack_8e;
  b.typeIndex = particle.typeIndex;
  a._58_6_ = particle._58_6_;
  a.typeIndex = particle.typeIndex;
  a.position.y = particle.position.y;
  a.position.x = particle.position.x;
  a.p.x = particle.p.x;
  a.p.y = particle.p.y;
  a.p.z = particle.p.z;
  a.factor = particle.factor;
  a.invGamma = particle.invGamma;
  b.position.y = particle.position.y;
  b.position.x = particle.position.x;
  b.p.x = particle.p.x;
  b.p.y = particle.p.y;
  b.p.z = particle.p.z;
  b.factor = particle.factor;
  b.invGamma = particle.invGamma;
  gtest_ar_.success_ =
       BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
       eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
                 ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *)this,a,b);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_d8,&gtest_ar_,"this->eqParticles_(particle, copyParticle)","false"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x70,local_d8.c_str_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::String::~String(&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Assignment)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(432.453, -3452.15, -15.125);
    MomentumType momentum(431.124, -54.12, 5643.176);
    FactorType factor = 1.9945;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle;
    copyParticle = particle;
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}